

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.hpp
# Opt level: O0

value_ptr __thiscall
pstore::dump::
make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
          (dump *this,uchar **first,uchar **last,_func_shared_ptr<pstore::dump::value>_uchar_ptr *mk
          )

{
  anon_class_16_2_01098c5c __f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  undefined1 local_40 [8];
  container members;
  _func_shared_ptr<pstore::dump::value>_uchar_ptr *mk_local;
  uchar **last_local;
  uchar **first_local;
  
  members.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mk;
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            *)local_40);
  __f.mk = (_func_shared_ptr<pstore::dump::value>_uchar_ptr *)
           members.
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __f.members = (vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                 *)local_40;
  std::
  for_each<unsigned_char_const*,pstore::dump::make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>(unsigned_char_const*const&,unsigned_char_const*const&,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&))::_lambda(unsigned_char_const&)_1_>
            (*first,*last,__f);
  make_value(this,(container *)local_40);
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             *)local_40);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (InputIterator const & first, InputIterator const & last,
                              MakeValueFn mk = &details::default_make_value<ValueType const &>) {
            array::container members;
            std::for_each (first, last,
                           [&members, mk] (ValueType const & v) { members.emplace_back (mk (v)); });
            return make_value (std::move (members));
        }